

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

void duckdb::ApproxQuantileListOperation<signed_char>::
     Finalize<duckdb::list_entry_t,duckdb::ApproxQuantileState>
               (ApproxQuantileState *state,list_entry_t *target,AggregateFinalizeData *finalize_data
               )

{
  data_ptr_t pdVar1;
  FunctionData *pFVar2;
  Vector *pVVar3;
  idx_t iVar4;
  reference pvVar5;
  uint64_t uVar6;
  size_t q;
  ulong __n;
  Value local_38;
  
  if (state->pos != 0) {
    pFVar2 = optional_ptr<duckdb::FunctionData,_true>::operator->(&finalize_data->input->bind_data);
    pVVar3 = ListVector::GetEntry(finalize_data->result);
    iVar4 = ListVector::GetListSize(finalize_data->result);
    ListVector::Reserve(finalize_data->result,
                        ((long)pFVar2[2]._vptr_FunctionData - (long)pFVar2[1]._vptr_FunctionData >>
                        2) + iVar4);
    pdVar1 = pVVar3->data;
    duckdb_tdigest::TDigest::process(state->h);
    target->offset = iVar4;
    uVar6 = (long)pFVar2[2]._vptr_FunctionData - (long)pFVar2[1]._vptr_FunctionData >> 2;
    target->length = uVar6;
    for (__n = 0; __n < uVar6; __n = __n + 1) {
      pvVar5 = vector<float,_true>::get<true>((vector<float,_true> *)(pFVar2 + 1),__n);
      local_38 = duckdb_tdigest::TDigest::quantile(state->h,(double)*pvVar5);
      ApproxQuantileCoding::Decode<double,signed_char>(&local_38,(char *)(pdVar1 + __n + iVar4));
      uVar6 = target->length;
    }
    ListVector::SetListSize(finalize_data->result,uVar6 + target->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, RESULT_TYPE &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->template Cast<ApproximateQuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		D_ASSERT(state.h);
		state.h->compress();

		auto &entry = target;
		entry.offset = ridx;
		entry.length = bind_data.quantiles.size();
		for (size_t q = 0; q < entry.length; ++q) {
			const auto &quantile = bind_data.quantiles[q];
			const auto &source = state.h->quantile(quantile);
			auto &target = rdata[ridx + q];
			ApproxQuantileCoding::Decode(source, target);
		}

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}